

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O1

void minLiterals(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  int iVar14;
  undefined1 auVar15 [16];
  
  if (isSat == 0) {
    groupSize = 4;
    if (numOfVariables == 1) {
      numOfVariables = 2;
    }
    uVar7 = numOfVariables + 5;
    if (-1 < (int)(numOfVariables + 2U)) {
      uVar7 = numOfVariables + 2U;
    }
    groups = (int)uVar7 >> 2;
    numOfVariables = (uVar7 & 0xfffffffc) + 1;
    sVar10 = (long)(int)(uVar7 & 0xfffffffc | 2) << 2;
    permute = (int *)malloc(sVar10);
    unpermute = (int *)malloc(sVar10);
    piVar6 = (int *)malloc(sVar10);
    iVar9 = numOfVariables;
    auVar2 = _DAT_00104020;
    auVar1 = _DAT_00104010;
    idpermute = piVar6;
    if (0 < (long)numOfVariables) {
      uVar7 = numOfVariables + 1;
      lVar11 = (long)numOfVariables + -1;
      auVar13._8_4_ = (int)lVar11;
      auVar13._0_8_ = lVar11;
      auVar13._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar8 = 0;
      auVar13 = auVar13 ^ _DAT_00104020;
      do {
        iVar14 = (int)uVar8;
        auVar15._8_4_ = iVar14;
        auVar15._0_8_ = uVar8;
        auVar15._12_4_ = (int)(uVar8 >> 0x20);
        auVar15 = (auVar15 | auVar1) ^ auVar2;
        if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                    auVar13._4_4_ < auVar15._4_4_) & 1)) {
          piVar6[uVar8 + 1] = iVar14 + 1;
        }
        if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
            auVar15._12_4_ <= auVar13._12_4_) {
          piVar6[uVar8 + 2] = iVar14 + 2;
        }
        uVar8 = uVar8 + 2;
      } while ((uVar7 & 0xfffffffe) != uVar8);
    }
    heading(iVar9);
    initGlobalPermute();
    piVar6 = permute;
    if (0 < numOfVariables) {
      lVar11 = 1;
      do {
        piVar6[lVar11] = (int)lVar11;
        bVar12 = lVar11 < numOfVariables;
        lVar11 = lVar11 + 1;
      } while (bVar12);
    }
    if (1 < groups) {
      iVar9 = 0;
      do {
        mainUnsatGroup(iVar9,-1);
        iVar9 = iVar9 + 1;
      } while (iVar9 < groups + -1);
    }
    lastUnsatGroup(-1);
    setAnnealingPermute();
    if (1 < groups) {
      iVar9 = 0;
      do {
        mainUnsatGroup(iVar9,1);
        iVar9 = iVar9 + 1;
      } while (iVar9 < groups + -1);
    }
    lastUnsatGroup(1);
    return;
  }
  groupSize = 5;
  numOfVariables = ((numOfVariables + -1) / 5) * 5 + 5;
  groups = numOfVariables / 5;
  initModel(numOfVariables);
  iVar9 = numOfVariables;
  sVar10 = (long)numOfVariables * 4 + 4;
  idpermute = (int *)malloc(sVar10);
  permute = (int *)malloc(sVar10);
  unpermute = (int *)malloc(sVar10);
  permute1 = (int *)malloc(sVar10);
  unpermute1 = (int *)malloc(sVar10);
  heading(iVar9);
  piVar6 = idpermute;
  if (0 < numOfVariables) {
    lVar11 = 1;
    do {
      piVar6[lVar11] = (int)lVar11;
      bVar12 = lVar11 < numOfVariables;
      lVar11 = lVar11 + 1;
    } while (bVar12);
  }
  initGlobalPermute();
  piVar6 = permute;
  if (0 < numOfVariables) {
    lVar11 = 1;
    do {
      piVar6[lVar11] = (int)lVar11;
      bVar12 = lVar11 < numOfVariables;
      lVar11 = lVar11 + 1;
    } while (bVar12);
  }
  if (0 < groups) {
    iVar9 = 0;
    do {
      firstSatGroup(iVar9,-1);
      iVar9 = iVar9 + 1;
    } while (iVar9 < groups);
  }
  iVar9 = 0;
  do {
    iVar14 = iVar9;
    setAnnealingPermute1(iVar9);
    secondSatGroup(iVar14,1);
    piVar5 = unpermute1;
    piVar4 = unpermute;
    piVar3 = permute;
    piVar6 = permute1;
    if (iVar9 == 0) {
      if (0 < numOfVariables) {
        lVar11 = 0;
        do {
          piVar6[lVar11 + 1] = piVar3[lVar11 + 1];
          piVar5[lVar11 + 1] = piVar4[lVar11 + 1];
          lVar11 = lVar11 + 1;
        } while (lVar11 < numOfVariables);
      }
      initChums();
    }
    bVar12 = iVar9 == 0;
    iVar9 = iVar9 + 1;
  } while (bVar12);
  if (*stringOptions != (char *)0x0) {
    printModel(*stringOptions);
    return;
  }
  return;
}

Assistant:

void minLiterals ()
{
    int g,l,v;

    if (isSat)
    {
        groupSize = 5;
        numOfVariables = ((numOfVariables-1)/groupSize + 1) * groupSize;
        groups = numOfVariables/groupSize;
        initModel(numOfVariables);
        idpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        permute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        unpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
         permute1 = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
         unpermute1 = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        heading(numOfVariables);
       for (v=1;v<=numOfVariables;v++)
           idpermute[v] = v;

        initGlobalPermute();
        setPlainPermute();
        for (g=0;g<groups;g++)
            firstSatGroup (g, -1);


        for (l=0;l<2;l++)
        {
            setAnnealingPermute1(l);
            secondSatGroup(l, 1);
            if (l==0)
            {
                for (v=1;v<=numOfVariables;v++)
                {
                    permute1[v] = permute[v];
                    unpermute1[v] = unpermute[v];
                }
				initChums();
            }
        }
        if (stringOptions[MODEL] != NULL)
            printModel (stringOptions[MODEL]);
    }
    else
    {
        groupSize = 4;
        if (numOfVariables == 1)
            numOfVariables = 2;
        groups = (numOfVariables+2)/groupSize;
        numOfVariables = groupSize*groups + 1;
        permute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        unpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        idpermute = (int *) malloc ( (numOfVariables+1) * sizeof(int) );
        for (v=1;v<=numOfVariables;v++)
        {
            idpermute[v] = v;
        }
        heading(numOfVariables);


        initGlobalPermute();
        setPlainPermute();
        for (g=0;g<groups-1;g++)
            mainUnsatGroup (g,-1);
        lastUnsatGroup (-1);
        setAnnealingPermute();
        for (g=0;g<groups-1;g++)
            mainUnsatGroup (g,1);
        lastUnsatGroup (1);
    }
}